

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::getUpperBound
          (ConstraintsGroup *this,double time,VectorDynSize *upperBound)

{
  bool bVar1;
  size_t sVar2;
  undefined8 *puVar3;
  reverse_iterator constraintIterator;
  pointer local_48;
  double local_40;
  pointer local_38;
  pointer local_30;
  
  local_40 = time;
  bVar1 = isAnyTimeGroup(this);
  if (!bVar1) {
    iDynTree::VectorDynSize::reserve((ulong)upperBound);
    local_38 = (this->m_pimpl->orderedIntervals).
               super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_30 = (this->m_pimpl->orderedIntervals).
               super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    std::
    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>*,std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>>>>>,__gnu_cxx::__ops::_Iter_pred<iDynTree::optimalcontrol::ConstraintsGroup::ConstraintsGroupPimpl::findActiveConstraint(double)::_lambda(std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>const&)_1_>>
              (local_40,&local_48);
    if ((local_48 ==
         (this->m_pimpl->orderedIntervals).
         super__Vector_base<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
         ._M_impl.super__Vector_impl_data._M_start) ||
       (bVar1 = Constraint::getUpperBound
                          (*(Constraint **)
                            &(local_48[-1].
                              super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->constraint,upperBound), !bVar1)) {
      bVar1 = false;
    }
    else {
      sVar2 = Constraint::constraintSize
                        (*(Constraint **)
                          &(local_48[-1].
                            super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->constraint);
      bVar1 = true;
      if (sVar2 < this->m_pimpl->maxConstraintSize) {
        iDynTree::VectorDynSize::resize((ulong)upperBound);
        sVar2 = Constraint::constraintSize
                          (*(Constraint **)
                            &(local_48[-1].
                              super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->constraint);
        if (sVar2 < this->m_pimpl->maxConstraintSize) {
          do {
            puVar3 = (undefined8 *)iDynTree::VectorDynSize::operator()(upperBound,sVar2);
            *puVar3 = 0x3ff0000000000000;
            sVar2 = sVar2 + 1;
          } while (sVar2 < this->m_pimpl->maxConstraintSize);
        }
      }
    }
    return bVar1;
  }
  bVar1 = Constraint::getUpperBound
                    ((Constraint *)
                     ((this->m_pimpl->group)._M_h._M_before_begin._M_nxt[5]._M_nxt)->_M_nxt,
                     upperBound);
  return bVar1;
}

Assistant:

bool ConstraintsGroup::getUpperBound(double time, VectorDynSize &upperBound)
        {
            if (isAnyTimeGroup()) {
                return m_pimpl->group.begin()->second.get()->constraint->getUpperBound(upperBound);
            }

            upperBound.reserve(m_pimpl->maxConstraintSize);

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()){ //no active constraint
                return false; //to be considered as unbounded
            }

            if (!(constraintIterator->get()->constraint->getUpperBound(upperBound))) {
                return false;
            }

            if (constraintIterator->get()->constraint->constraintSize() < m_pimpl->maxConstraintSize){
                upperBound.resize(m_pimpl->maxConstraintSize);
                for (size_t i = constraintIterator->get()->constraint->constraintSize(); i < m_pimpl->maxConstraintSize; ++i)
                    upperBound(static_cast<unsigned int>(i)) = 1.0; //append -1.0 at the end to equate the maxConstraintSize.
            }

            return true;
        }